

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMLSParserImpl::DOMLSParserImpl
          (DOMLSParserImpl *this,XMLValidator *valToAdopt,MemoryManager *manager,
          XMLGrammarPool *gramPool)

{
  XMLScanner *this_00;
  DOMStringListImpl *this_01;
  XMLGrammarPool *gramPool_local;
  MemoryManager *manager_local;
  XMLValidator *valToAdopt_local;
  DOMLSParserImpl *this_local;
  
  AbstractDOMParser::AbstractDOMParser(&this->super_AbstractDOMParser,valToAdopt,manager,gramPool);
  DOMLSParser::DOMLSParser(&this->super_DOMLSParser);
  DOMConfiguration::DOMConfiguration(&this->super_DOMConfiguration);
  (this->super_AbstractDOMParser).super_XMLDocumentHandler._vptr_XMLDocumentHandler =
       (_func_int **)&PTR__DOMLSParserImpl_00531858;
  (this->super_AbstractDOMParser).super_XMLErrorReporter._vptr_XMLErrorReporter =
       (_func_int **)&PTR__DOMLSParserImpl_00531ab0;
  (this->super_AbstractDOMParser).super_XMLEntityHandler._vptr_XMLEntityHandler =
       (_func_int **)&PTR__DOMLSParserImpl_00531ae0;
  (this->super_AbstractDOMParser).super_DocTypeHandler._vptr_DocTypeHandler =
       (_func_int **)&PTR__DOMLSParserImpl_00531b28;
  (this->super_AbstractDOMParser).super_PSVIHandler._vptr_PSVIHandler =
       (_func_int **)&PTR__DOMLSParserImpl_00531bc8;
  (this->super_DOMLSParser)._vptr_DOMLSParser = (_func_int **)&PTR__DOMLSParserImpl_00531c00;
  (this->super_DOMConfiguration)._vptr_DOMConfiguration = (_func_int **)&DAT_00531cc0;
  this->fEntityResolver = (DOMLSResourceResolver *)0x0;
  this->fXMLEntityResolver = (XMLEntityResolver *)0x0;
  this->fErrorHandler = (DOMErrorHandler *)0x0;
  this->fFilter = (DOMLSParserFilter *)0x0;
  this->fCharsetOverridesXMLEncoding = true;
  this->fUserAdoptsDocument = false;
  this->fSupportedParameters = (DOMStringListImpl *)0x0;
  this->fFilterAction =
       (ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher> *)0x0
  ;
  this->fFilterDelayedTextNodes = (ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *)0x0;
  this->fWrapNodesInDocumentFragment = (DOMDocumentFragment *)0x0;
  this->fWrapNodesContext = (DOMNode *)0x0;
  this_00 = AbstractDOMParser::getScanner(&this->super_AbstractDOMParser);
  XMLScanner::setNormalizeData(this_00,false);
  this_01 = (DOMStringListImpl *)
            XMemory::operator_new(0x10,(this->super_AbstractDOMParser).fMemoryManager);
  DOMStringListImpl::DOMStringListImpl(this_01,0x30,manager);
  this->fSupportedParameters = this_01;
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMResourceResolver);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMErrorHandler);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesEntityResolver);
  DOMStringListImpl::add
            (this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesSchemaExternalSchemaLocation);
  DOMStringListImpl::add
            (this->fSupportedParameters,
             (XMLCh *)XMLUni::fgXercesSchemaExternalNoNameSpaceSchemaLocation);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesSecurityManager);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesScannerName);
  DOMStringListImpl::add
            (this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesParserUseDocumentFromImplementation
            );
  DOMStringListImpl::add
            (this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMCharsetOverridesXMLEncoding);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMDisallowDoctype);
  DOMStringListImpl::add
            (this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMIgnoreUnknownCharacterDenormalization)
  ;
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMNamespaces);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMSupportedMediatypesOnly);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMValidate);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMValidateIfSchema);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMWellFormed);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMCanonicalForm);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMCDATASections);
  DOMStringListImpl::add
            (this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMCheckCharacterNormalization);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMComments);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMDatatypeNormalization);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMElementContentWhitespace);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMEntities);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMNamespaceDeclarations);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMNormalizeCharacters);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMSchemaLocation);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMSchemaType);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMSplitCDATASections);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMInfoset);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesSchema);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesSchemaFullChecking);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesUserAdoptsDOMDocument);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesLoadExternalDTD);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesLoadSchema);
  DOMStringListImpl::add
            (this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesContinueAfterFatalError);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesValidationErrorAsFatal)
  ;
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesCacheGrammarFromParse);
  DOMStringListImpl::add
            (this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesUseCachedGrammarInParse);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesCalculateSrcOfs);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesStandardUriConformant);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesDOMHasPSVIInfo);
  DOMStringListImpl::add
            (this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesGenerateSyntheticAnnotations);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesValidateAnnotations);
  DOMStringListImpl::add
            (this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesIdentityConstraintChecking);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesIgnoreCachedDTD);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesIgnoreAnnotations);
  DOMStringListImpl::add
            (this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesDisableDefaultEntityResolution);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesSkipDTDValidation);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesDoXInclude);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgXercesHandleMultipleImports);
  AbstractDOMParser::setDoNamespaces(&this->super_AbstractDOMParser,true);
  return;
}

Assistant:

DOMLSParserImpl::DOMLSParserImpl( XMLValidator* const   valToAdopt
                              , MemoryManager* const  manager
                              , XMLGrammarPool* const gramPool) :

AbstractDOMParser(valToAdopt, manager, gramPool)
, fEntityResolver(0)
, fXMLEntityResolver(0)
, fErrorHandler(0)
, fFilter(0)
, fCharsetOverridesXMLEncoding(true)
, fUserAdoptsDocument(false)
, fSupportedParameters(0)
, fFilterAction(0)
, fFilterDelayedTextNodes(0)
, fWrapNodesInDocumentFragment(0)
, fWrapNodesContext(0)
{
    // dom spec has different default from scanner's default, so set explicitly
    getScanner()->setNormalizeData(false);

    fSupportedParameters=new (fMemoryManager) DOMStringListImpl(48, manager);
    fSupportedParameters->add(XMLUni::fgDOMResourceResolver);
    fSupportedParameters->add(XMLUni::fgDOMErrorHandler);
    fSupportedParameters->add(XMLUni::fgXercesEntityResolver);
    fSupportedParameters->add(XMLUni::fgXercesSchemaExternalSchemaLocation);
	fSupportedParameters->add(XMLUni::fgXercesSchemaExternalNoNameSpaceSchemaLocation);
	fSupportedParameters->add(XMLUni::fgXercesSecurityManager);
	fSupportedParameters->add(XMLUni::fgXercesScannerName);
    fSupportedParameters->add(XMLUni::fgXercesParserUseDocumentFromImplementation);
    fSupportedParameters->add(XMLUni::fgDOMCharsetOverridesXMLEncoding);
    fSupportedParameters->add(XMLUni::fgDOMDisallowDoctype);
    fSupportedParameters->add(XMLUni::fgDOMIgnoreUnknownCharacterDenormalization);
    fSupportedParameters->add(XMLUni::fgDOMNamespaces);
    fSupportedParameters->add(XMLUni::fgDOMSupportedMediatypesOnly);
    fSupportedParameters->add(XMLUni::fgDOMValidate);
    fSupportedParameters->add(XMLUni::fgDOMValidateIfSchema);
    fSupportedParameters->add(XMLUni::fgDOMWellFormed);
    fSupportedParameters->add(XMLUni::fgDOMCanonicalForm);
    fSupportedParameters->add(XMLUni::fgDOMCDATASections);
    fSupportedParameters->add(XMLUni::fgDOMCheckCharacterNormalization);
    fSupportedParameters->add(XMLUni::fgDOMComments);
    fSupportedParameters->add(XMLUni::fgDOMDatatypeNormalization);
    fSupportedParameters->add(XMLUni::fgDOMElementContentWhitespace);
    fSupportedParameters->add(XMLUni::fgDOMEntities);
    fSupportedParameters->add(XMLUni::fgDOMNamespaceDeclarations);
    fSupportedParameters->add(XMLUni::fgDOMNormalizeCharacters);
    fSupportedParameters->add(XMLUni::fgDOMSchemaLocation);
    fSupportedParameters->add(XMLUni::fgDOMSchemaType);
    fSupportedParameters->add(XMLUni::fgDOMSplitCDATASections);
    fSupportedParameters->add(XMLUni::fgDOMInfoset);
    fSupportedParameters->add(XMLUni::fgXercesSchema);
    fSupportedParameters->add(XMLUni::fgXercesSchemaFullChecking);
    fSupportedParameters->add(XMLUni::fgXercesUserAdoptsDOMDocument);
    fSupportedParameters->add(XMLUni::fgXercesLoadExternalDTD);
    fSupportedParameters->add(XMLUni::fgXercesLoadSchema);
    fSupportedParameters->add(XMLUni::fgXercesContinueAfterFatalError);
    fSupportedParameters->add(XMLUni::fgXercesValidationErrorAsFatal);
    fSupportedParameters->add(XMLUni::fgXercesCacheGrammarFromParse);
    fSupportedParameters->add(XMLUni::fgXercesUseCachedGrammarInParse);
    fSupportedParameters->add(XMLUni::fgXercesCalculateSrcOfs);
    fSupportedParameters->add(XMLUni::fgXercesStandardUriConformant);
    fSupportedParameters->add(XMLUni::fgXercesDOMHasPSVIInfo);
    fSupportedParameters->add(XMLUni::fgXercesGenerateSyntheticAnnotations);
    fSupportedParameters->add(XMLUni::fgXercesValidateAnnotations);
    fSupportedParameters->add(XMLUni::fgXercesIdentityConstraintChecking);
    fSupportedParameters->add(XMLUni::fgXercesIgnoreCachedDTD);
    fSupportedParameters->add(XMLUni::fgXercesIgnoreAnnotations);
    fSupportedParameters->add(XMLUni::fgXercesDisableDefaultEntityResolution);
    fSupportedParameters->add(XMLUni::fgXercesSkipDTDValidation);
    fSupportedParameters->add(XMLUni::fgXercesDoXInclude);
    fSupportedParameters->add(XMLUni::fgXercesHandleMultipleImports);

    // LSParser by default does namespace processing
    setDoNamespaces(true);
}